

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_3_4::RgbaYca::RGBAtoYCA(V3f *yw,int n,bool aIsValid,Rgba *rgbaIn,Rgba *ycaOut)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Rgba RVar5;
  char cVar6;
  long lVar7;
  ushort uVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  ulong uVar13;
  Rgba RVar14;
  ulong uVar15;
  half hVar16;
  float fVar17;
  
  lVar7 = _imath_half_to_float_table;
  if (0 < n) {
    fVar2 = yw->x;
    fVar3 = yw->y;
    fVar4 = yw->z;
    uVar15 = 0;
    do {
      RVar5 = rgbaIn[uVar15];
      if (((~RVar5._0_4_ & 0x7c00) == 0) ||
         (pfVar1 = (float *)(lVar7 + ((ulong)RVar5 & 0xffff) * 4), RVar14 = RVar5,
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        RVar14.r._h = 0;
        RVar14.g._h = 0;
        RVar14.b._h = 0;
        RVar14.a._h = 0;
      }
      hVar16 = RVar5.g._h;
      if (((~RVar5._2_4_ & 0x7c00) == 0) ||
         (pfVar1 = (float *)(lVar7 + ((ulong)RVar5 >> 0x10 & 0xffff) * 4),
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        hVar16._h = 0;
      }
      if (((~(ulong)RVar5 & 0x7c0000000000) == 0) ||
         (uVar13 = (ulong)RVar5 >> 0x20, pfVar1 = (float *)(lVar7 + (uVar13 & 0xffff) * 4),
         *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
        uVar13 = 0;
      }
      fVar9 = *(float *)(lVar7 + ((ulong)RVar14 & 0xffff) * 4);
      fVar17 = *(float *)(lVar7 + (ulong)hVar16._h * 4);
      fVar12 = *(float *)(lVar7 + (uVar13 & 0xffff) * 4);
      if (((fVar9 != fVar17) || (fVar17 != fVar12)) || (NAN(fVar17) || NAN(fVar12))) {
        fVar17 = fVar12 * fVar4 + fVar9 * fVar2 + fVar17 * fVar3;
        fVar9 = ABS(fVar17);
        uVar11 = (uint)fVar17 >> 0x10 & 0x8000;
        if ((uint)fVar9 < 0x38800000) {
          if ((0x33000000 < (uint)fVar9) &&
             (uVar10 = (uint)fVar9 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar9 >> 0x17),
             uVar11 = uVar11 | uVar10 >> (0x7eU - cVar6 & 0x1f),
             0x80000000 < uVar10 << (cVar6 + 0xa2U & 0x1f))) {
            uVar11 = uVar11 + 1;
          }
        }
        else if ((uint)fVar9 < 0x7f800000) {
          if ((uint)fVar9 < 0x477ff000) {
            uVar11 = (int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd | uVar11;
          }
          else {
            uVar11 = uVar11 | 0x7c00;
          }
        }
        else {
          uVar11 = uVar11 | 0x7c00;
          if (fVar9 != INFINITY) {
            uVar10 = (uint)fVar9 >> 0xd & 0x3ff;
            uVar11 = uVar11 | uVar10 | (uint)(uVar10 == 0);
          }
        }
        ycaOut[uVar15].g._h = (uint16_t)uVar11;
        fVar9 = *(float *)(lVar7 + (ulong)(uVar11 & 0xffff) * 4);
        fVar17 = *(float *)(lVar7 + ((ulong)RVar14 & 0xffff) * 4) - fVar9;
        if (fVar9 * 65504.0 <= ABS(fVar17)) {
          uVar8 = 0;
        }
        else {
          fVar17 = fVar17 / fVar9;
          fVar12 = ABS(fVar17);
          uVar8 = (ushort)((uint)fVar17 >> 0x10) & 0x8000;
          if ((uint)fVar12 < 0x38800000) {
            if ((0x33000000 < (uint)fVar12) &&
               (uVar11 = (uint)fVar12 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar12 >> 0x17),
               uVar8 = uVar8 | (ushort)(uVar11 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar11 << (cVar6 + 0xa2U & 0x1f))) {
              uVar8 = uVar8 + 1;
            }
          }
          else if ((uint)fVar12 < 0x7f800000) {
            if ((uint)fVar12 < 0x477ff000) {
              uVar8 = (ushort)((int)fVar12 + 0x8000fff + (uint)(((uint)fVar12 >> 0xd & 1) != 0) >>
                              0xd) | uVar8;
            }
            else {
              uVar8 = uVar8 | 0x7c00;
            }
          }
          else {
            uVar8 = uVar8 | 0x7c00;
            if (fVar12 != INFINITY) {
              uVar11 = (uint)fVar12 >> 0xd & 0x3ff;
              uVar8 = uVar8 | (ushort)uVar11 | (ushort)(uVar11 == 0);
            }
          }
        }
        ycaOut[uVar15].r._h = uVar8;
        fVar17 = *(float *)(lVar7 + (uVar13 & 0xffff) * 4) - fVar9;
        if (fVar9 * 65504.0 <= ABS(fVar17)) {
          ycaOut[uVar15].b._h = 0;
        }
        else {
          fVar17 = fVar17 / fVar9;
          fVar9 = ABS(fVar17);
          uVar8 = (ushort)((uint)fVar17 >> 0x10) & 0x8000;
          if ((uint)fVar9 < 0x38800000) {
            if ((0x33000000 < (uint)fVar9) &&
               (uVar11 = (uint)fVar9 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar9 >> 0x17),
               uVar8 = uVar8 | (ushort)(uVar11 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar11 << (cVar6 + 0xa2U & 0x1f))) {
              uVar8 = uVar8 + 1;
            }
          }
          else if ((uint)fVar9 < 0x7f800000) {
            if ((uint)fVar9 < 0x477ff000) {
              uVar8 = (ushort)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar8;
            }
            else {
              uVar8 = uVar8 | 0x7c00;
            }
          }
          else {
            uVar8 = uVar8 | 0x7c00;
            if (fVar9 != INFINITY) {
              uVar11 = (uint)fVar9 >> 0xd & 0x3ff;
              uVar8 = uVar8 | (ushort)uVar11 | (ushort)(uVar11 == 0);
            }
          }
          ycaOut[uVar15].b._h = uVar8;
        }
      }
      else {
        ycaOut[uVar15].r._h = 0;
        ycaOut[uVar15].g._h = hVar16._h;
        ycaOut[uVar15].b._h = 0;
      }
      hVar16 = RVar5.a._h;
      if (!aIsValid) {
        hVar16._h = 0x3c00;
      }
      ycaOut[uVar15].a._h = hVar16._h;
      uVar15 = uVar15 + 1;
    } while ((uint)n != uVar15);
  }
  return;
}

Assistant:

void
RGBAtoYCA (
    const V3f& yw,
    int        n,
    bool       aIsValid,
    const Rgba rgbaIn[/*n*/],
    Rgba       ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        Rgba  in  = rgbaIn[i];
        Rgba& out = ycaOut[i];

        //
        // Conversion to YCA and subsequent chroma subsampling
        // work only if R, G and B are finite and non-negative.
        //

        if (!in.r.isFinite () || in.r < 0) in.r = 0;

        if (!in.g.isFinite () || in.g < 0) in.g = 0;

        if (!in.b.isFinite () || in.b < 0) in.b = 0;

        if (in.r == in.g && in.g == in.b)
        {
            //
            // Special case -- R, G and B are equal. To avoid rounding
            // errors, we explicitly set the output luminance channel
            // to G, and the chroma channels to 0.
            //
            // The special cases here and in YCAtoRGBA() ensure that
            // converting black-and white images from RGBA to YCA and
            // back is lossless.
            //

            out.r = 0;
            out.g = in.g;
            out.b = 0;
        }
        else
        {
            out.g = in.r * yw.x + in.g * yw.y + in.b * yw.z;

            float Y = out.g;

            if (abs (in.r - Y) < HALF_MAX * Y)
                out.r = (in.r - Y) / Y;
            else
                out.r = 0;

            if (abs (in.b - Y) < HALF_MAX * Y)
                out.b = (in.b - Y) / Y;
            else
                out.b = 0;
        }

        if (aIsValid)
            out.a = in.a;
        else
            out.a = 1;
    }
}